

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

natwm_error button_handle_motion(natwm_state *state,uint16_t mouse_mask,int16_t x,int16_t y)

{
  short offset_x_00;
  short offset_y_00;
  int16_t offset_y;
  int16_t offset_x;
  int16_t y_local;
  int16_t x_local;
  uint16_t mouse_mask_local;
  natwm_state *state_local;
  
  if (state->button_state->grabbed_client == (client *)0x0) {
    internal_logger(natwm_logger,LEVEL_ERROR,
                    "Received motion event when there isn\'t a currently grabbed client");
    state_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else if ((state->button_state->grabbed_client->is_fullscreen & 1U) == 0) {
    offset_x_00 = x - state->button_state->start_x;
    offset_y_00 = y - state->button_state->start_y;
    if ((mouse_mask & 0x100) == 0) {
      if ((mouse_mask & 0x400) != 0) {
        resize_helper(state,offset_x_00,offset_y_00);
      }
      state_local._4_4_ = NO_ERROR;
    }
    else {
      state_local._4_4_ =
           client_handle_drag(state,state->button_state->grabbed_client,offset_x_00,offset_y_00);
    }
  }
  else {
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error button_handle_motion(struct natwm_state *state, uint16_t mouse_mask, int16_t x,
                                      int16_t y)
{
        if (state->button_state->grabbed_client == NULL) {
                LOG_ERROR(natwm_logger,
                          "Received motion event when there isn't a currently grabbed client");

                return INVALID_INPUT_ERROR;
        }

        if (state->button_state->grabbed_client->is_fullscreen) {
                // Ignore full screen clients
                return NO_ERROR;
        }

        int16_t offset_x = (int16_t)(x - state->button_state->start_x);
        int16_t offset_y = (int16_t)(y - state->button_state->start_y);

        if (mouse_mask & XCB_BUTTON_MASK_1) {
                return client_handle_drag(
                        state, state->button_state->grabbed_client, offset_x, offset_y);
        }

        if (mouse_mask & XCB_BUTTON_MASK_3) {
                resize_helper(state, offset_x, offset_y);
        }

        return NO_ERROR;
}